

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  __enable_if_execution_policy<const___pstl::execution::v1::parallel_policy_&,_double> _Var1;
  double dVar2;
  __enable_if_execution_policy<const___pstl::execution::v1::parallel_unsequenced_policy_&,_double>
  _Var3;
  double __x;
  double *pdVar4;
  rep_conflict rVar5;
  bool bVar6;
  __enable_if_execution_policy<const___pstl::execution::v1::unsequenced_policy_&,_bool> _Var7;
  path *ppVar8;
  iterator __first;
  iterator __last;
  reference __p;
  basic_ostream<char,_std::char_traits<char>_> *this;
  reference __s;
  iterator iVar9;
  iterator iVar10;
  size_type sVar11;
  iterator __first2;
  ostream *poVar12;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var13;
  reference pvVar14;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first2_00;
  difference_type dVar15;
  reference pdVar16;
  char *__command;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar20;
  int local_74c;
  undefined1 local_748 [4];
  int i;
  ostream local_728 [8];
  ofstream output_file;
  undefined1 local_528 [8];
  string mkdir_command;
  undefined1 local_500 [8];
  string output_dir;
  difference_type dist;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_498;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  answer;
  anon_class_8_1_ba1d7983_for__M_comp comparison;
  type tStack_460;
  bool any_greater_than_50;
  duration<double,_std::ratio<1L,_1000L>_> local_458;
  duration<double,_std::ratio<1L,_1000L>_> ms;
  time_point t2;
  double median;
  size_type half_way;
  vector<double,_std::allocator<double>_> v2;
  time_point t1;
  double skew;
  anon_class_16_2_62d78d09 third_moment;
  double std;
  double var;
  double mean;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_368;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_350;
  undefined1 local_338 [8];
  vector<double,_std::allocator<double>_> v;
  ifstream f;
  path *d;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *__range1_1;
  string local_e8;
  directory_entry *local_c8;
  directory_entry *p;
  undefined1 local_b0 [8];
  recursive_directory_iterator __end1;
  undefined1 local_90 [8];
  recursive_directory_iterator __begin1;
  char *local_70;
  path local_68;
  recursive_directory_iterator local_40;
  recursive_directory_iterator *local_30;
  recursive_directory_iterator *__range1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> data_files
  ;
  
  data_files.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  ::std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         &__range1);
  local_70 = getenv("HOME");
  ::std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_68,&local_70,auto_format);
  ::std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&local_40,&local_68);
  ::std::filesystem::__cxx11::path::~path(&local_68);
  local_30 = &local_40;
  ::std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount,local_30);
  ::std::filesystem::__cxx11::begin
            ((__cxx11 *)local_90,(recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  ::std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&p,local_30);
  ::std::filesystem::__cxx11::end((recursive_directory_iterator *)local_b0);
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&p);
  while (bVar6 = ::std::filesystem::__cxx11::operator!=
                           ((recursive_directory_iterator *)local_90,
                            (recursive_directory_iterator *)local_b0), bVar6) {
    local_c8 = (directory_entry *)
               ::std::filesystem::__cxx11::recursive_directory_iterator::operator*
                         ((recursive_directory_iterator *)local_90);
    ppVar8 = ::std::filesystem::__cxx11::directory_entry::path(local_c8);
    ::std::filesystem::__cxx11::path::string(&local_e8,ppVar8);
    bVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&local_e8,"_rse_workshop.dat");
    ::std::__cxx11::string::~string((string *)&local_e8);
    if (bVar6) {
      ppVar8 = ::std::filesystem::__cxx11::directory_entry::path(local_c8);
      ::std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&__range1,ppVar8);
    }
    ::std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_90);
  }
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_b0);
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_90);
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_40)
  ;
  __first = ::std::
            vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)&__range1);
  __last = ::std::
           vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
           end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                *)&__range1);
  ::std::
  sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>>
            ((__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
              )__first._M_current,
             (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
              )__last._M_current);
  __end1_1 = ::std::
             vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                      *)&__range1);
  d = (path *)::std::
              vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
              ::end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)&__range1);
  while (bVar6 = __gnu_cxx::
                 operator==<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                           (&__end1_1,
                            (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                             *)&d), ((bVar6 ^ 0xffU) & 1) != 0) {
    __p = __gnu_cxx::
          __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
          ::operator*(&__end1_1);
    this = ::std::filesystem::__cxx11::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&::std::cout,__p);
    ::std::ostream::operator<<((ostream *)this,::std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
    ::operator++(&__end1_1);
  }
  __s = ::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        operator[]((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    *)&__range1,0);
  ::std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)
             &v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__s,_S_in);
  ::std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_350,
             (istream_type *)
             &v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  ::std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator(&local_368);
  ::std::allocator<double>::allocator((allocator<double> *)((long)&mean + 7));
  ::std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)local_338,&local_350,&local_368,
             (allocator<double> *)((long)&mean + 7));
  ::std::allocator<double>::~allocator((allocator<double> *)((long)&mean + 7));
  iVar9 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  iVar10 = ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_338);
  _Var1 = ::std::
          reduce<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((parallel_policy *)&__pstl::execution::v1::par,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar9._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar10._M_current,0.0);
  sVar11 = ::std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)local_338);
  auVar17._8_4_ = (int)(sVar11 >> 0x20);
  auVar17._0_8_ = sVar11;
  auVar17._12_4_ = 0x45300000;
  dVar2 = _Var1 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0));
  iVar9 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  iVar10 = ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_338);
  __first2 = ::std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_338);
  _Var3 = ::std::
          transform_reduce<__pstl::execution::v1::parallel_unsequenced_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((parallel_unsequenced_policy *)&__pstl::execution::v1::par_unseq,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar9._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar10._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __first2._M_current,0.0);
  sVar11 = ::std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)local_338);
  auVar18._8_4_ = (int)(sVar11 >> 0x20);
  auVar18._0_8_ = sVar11;
  auVar18._12_4_ = 0x45300000;
  __x = _Var3 / ((auVar18._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) - dVar2 * dVar2;
  pdVar4 = (double *)sqrt(__x);
  poVar12 = ::std::operator<<((ostream *)&::std::cout,"mean:   ");
  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,dVar2);
  ::std::operator<<(poVar12,'\n');
  poVar12 = ::std::operator<<((ostream *)&::std::cout,"var:    ");
  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,__x);
  ::std::operator<<(poVar12,'\n');
  iVar9 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  iVar10 = ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_338);
  _Var1 = ::std::
          transform_reduce<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<void>,main::__1>
                    (0,dVar2,pdVar4,&__pstl::execution::v1::par,iVar9._M_current,iVar10._M_current);
  sVar11 = ::std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)local_338);
  auVar19._8_4_ = (int)(sVar11 >> 0x20);
  auVar19._0_8_ = sVar11;
  auVar19._12_4_ = 0x45300000;
  poVar12 = ::std::operator<<((ostream *)&::std::cout,"skew:   ");
  poVar12 = (ostream *)
            ::std::ostream::operator<<
                      (poVar12,_Var1 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)sVar11) -
                                       4503599627370496.0)));
  ::std::operator<<(poVar12,'\n');
  v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)::std::chrono::_V2::system_clock::now();
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&half_way,
             (vector<double,_std::allocator<double>_> *)local_338);
  sVar11 = ::std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)&half_way);
  iVar9 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)&half_way);
  iVar10 = ::std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)&half_way);
  _Var13 = ::std::
           next<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                     (iVar10._M_current,sVar11 >> 1);
  iVar10 = ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)&half_way);
  ::std::
  nth_element<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((parallel_policy *)&__pstl::execution::v1::par,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar9._M_current,_Var13,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar10._M_current);
  pvVar14 = ::std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)&half_way,sVar11 >> 1);
  dVar2 = *pvVar14;
  ms.__r = (rep_conflict)::std::chrono::_V2::system_clock::now();
  tStack_460 = ::std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&ms,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
  ::std::chrono::duration<double,std::ratio<1l,1000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_458,&stack0xfffffffffffffba0);
  poVar12 = (ostream *)::std::ostream::operator<<((ostream *)&::std::cout,::std::fixed);
  poVar12 = ::std::operator<<(poVar12,"median took ");
  rVar5 = ::std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_458);
  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,rVar5);
  ::std::operator<<(poVar12," ms\n");
  poVar12 = ::std::operator<<((ostream *)&::std::cout,"median: ");
  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,dVar2);
  ::std::operator<<(poVar12,'\n');
  iVar9 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  iVar10 = ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_338);
  _Var7 = ::std::
          any_of<__pstl::execution::v1::unsequenced_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__2>
                    (&__pstl::execution::v1::unseq,iVar9._M_current,iVar10._M_current);
  poVar12 = (ostream *)::std::ostream::operator<<((ostream *)&::std::cout,::std::boolalpha);
  poVar12 = ::std::operator<<(poVar12,"Any greater than 50? ");
  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,_Var7);
  ::std::operator<<(poVar12,'\n');
  answer.second._M_current = pdVar4;
  iVar9 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  iVar10 = ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_338);
  _Var13 = ::std::
           prev<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                     (iVar10._M_current,1);
  iVar10 = ::std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_338);
  __first2_00 = ::std::
                next<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          (iVar10._M_current,1);
  pVar20 = ::std::
           mismatch<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__0>
                     ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      iVar9._M_current,_Var13,__first2_00,
                      (anon_class_8_1_ba1d7983_for__M_comp)answer.second._M_current);
  answer.first = pVar20.second._M_current;
  local_498 = pVar20.first._M_current;
  iVar9 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  output_dir.field_2._8_8_ = local_498._M_current;
  dVar15 = ::std::
           distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                     ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      iVar9._M_current,local_498);
  poVar12 = ::std::operator<<((ostream *)&::std::cout,"Position ");
  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,dVar15);
  poVar12 = ::std::operator<<(poVar12,", first ");
  pdVar16 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator*(&local_498);
  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,*pdVar16);
  poVar12 = ::std::operator<<(poVar12," second: ");
  pdVar16 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator*(&answer.first);
  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,*pdVar16);
  ::std::operator<<(poVar12,'\n');
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_500,"./output",
             (allocator<char> *)(mkdir_command.field_2._M_local_buf + 0xf));
  ::std::allocator<char>::~allocator((allocator<char> *)(mkdir_command.field_2._M_local_buf + 0xf));
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528,
                   "mkdir -p ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500);
  __command = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528);
  system(__command);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500,
                   "/results.dat");
  ::std::ofstream::ofstream(local_728,(string *)local_748,_S_out);
  ::std::__cxx11::string::~string((string *)local_748);
  pvVar14 = ::std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_338,0);
  ::std::ostream::operator<<(local_728,*pvVar14);
  for (local_74c = 1;
      sVar11 = ::std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)local_338),
      (ulong)(long)local_74c < sVar11; local_74c = local_74c + 1) {
    poVar12 = ::std::operator<<(local_728,',');
    pvVar14 = ::std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_338,(long)local_74c);
    ::std::ostream::operator<<(poVar12,*pvVar14);
  }
  ::std::ofstream::close();
  ::std::ofstream::~ofstream(local_728);
  ::std::__cxx11::string::~string((string *)local_528);
  ::std::__cxx11::string::~string((string *)local_500);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&half_way);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_338);
  ::std::ifstream::~ifstream
            (&v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  ::std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
          )&__range1);
  return data_files.
         super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find all files like *_rse_workshop.dat under a specific directory
    std::vector<fs::path> data_files;
    for (auto &p : fs::recursive_directory_iterator(std::getenv("HOME")))
    {
        if (p.path().string().ends_with("_rse_workshop.dat"))
        {
            data_files.emplace_back(p.path());
        }
    }

    // This is just to make sure the same file is first, so the numbers later are the same on each version.
    // The sort isn't necessary!
    std::sort(data_files.begin(), data_files.end());

    // Which data files did we find? (range-for loop)
    for (const auto &d : data_files)
    {
        std::cout << d << std::endl;
    }

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    const double mean = std::reduce(std::execution::par, v.begin(), v.end(), 0.0) / v.size();
    const double var =
        std::transform_reduce(std::execution::par_unseq, v.begin(), v.end(), v.begin(), 0.0) / v.size() - mean * mean;
    const double std = std::sqrt(var);

    std::cout << "mean:   " << mean << '\n';
    std::cout << "var:    " << var << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    auto third_moment = [mean, std](const double x) { return std::pow((x - mean) / std, 3); };
    const double skew =
        std::transform_reduce(std::execution::par, v.begin(), v.end(), 0.0, std::plus<>(), third_moment) / v.size();

    std::cout << "skew:   " << skew << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    auto t1 = std::chrono::high_resolution_clock::now();

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;

    auto half_way = v2.size() / 2;
    std::nth_element(std::execution::par, v2.begin(), std::next(v2.begin(), half_way), v2.end());
    const double median = v2.at(half_way);

    auto t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> ms = t2 - t1;
    std::cout << std::fixed << "median took " << ms.count() << " ms\n";

    std::cout << "median: " << median << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Any of the elements > 50?
    const bool any_greater_than_50 =
        std::any_of(std::execution::unseq, v.begin(), v.end(), [](const double x) { return x > 50.0; });
    std::cout << std::boolalpha << "Any greater than 50? " << any_greater_than_50 << '\n';

    // First position where consecutive elements differ by more than twice the standard deviation
    auto comparison = [std](const double x, const double y) { return std::fabs(x - y) < 2.0 * std; };
    const auto answer = std::mismatch(v.begin(), std::prev(v.end()), std::next(v.begin()), comparison);

    const auto dist = std::distance(v.begin(), answer.first);
    std::cout << "Position " << dist << ", first " << *answer.first << " second: " << *answer.second << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
}